

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

float stbtt_ScaleForPixelHeight(stbtt_fontinfo *info,float height)

{
  stbtt_int16 sVar1;
  stbtt_int16 sVar2;
  int fheight;
  float height_local;
  stbtt_fontinfo *info_local;
  
  sVar1 = ttSHORT(info->data + (long)info->hhea + 4);
  sVar2 = ttSHORT(info->data + (long)info->hhea + 6);
  return height / (float)((int)sVar1 - (int)sVar2);
}

Assistant:

STBTT_DEF float stbtt_ScaleForPixelHeight(const stbtt_fontinfo *info, float height)
{
   int fheight = ttSHORT(info->data + info->hhea + 4) - ttSHORT(info->data + info->hhea + 6);
   return (float) height / fheight;
}